

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O3

light_pcapng light_read_from_memory(uint32_t *memory,size_t size)

{
  uint *__src;
  uint uVar1;
  long lVar2;
  uint32_t uVar3;
  light_pcapng p_Var4;
  uint32_t *puVar5;
  ulong *puVar6;
  _light_option *p_Var7;
  light_pcapng p_Var8;
  void *x_ret;
  int32_t max_len;
  undefined8 uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint *local_68;
  uint32_t *local_60;
  light_pcapng local_58;
  size_t local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (size < 0xd) {
    local_58 = (light_pcapng)0x0;
  }
  else {
    local_58 = (light_pcapng)0x0;
    p_Var8 = (light_pcapng)0x0;
    do {
      p_Var4 = (light_pcapng)calloc(1,0x20);
      if (p_Var8 == (light_pcapng)0x0) {
        if (p_Var4 == (light_pcapng)0x0) {
          uVar9 = 0x60;
          goto LAB_001029fb;
        }
        if (local_58 == (light_pcapng)0x0) {
          local_58 = p_Var4;
        }
      }
      else {
        p_Var8->next_block = p_Var4;
        if (p_Var4 == (light_pcapng)0x0) {
          uVar9 = 0x68;
LAB_001029fb:
          fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
                  ,"__parse_mem_copy",uVar9);
          return local_58;
        }
      }
      uVar3 = *memory;
      p_Var4->block_type = uVar3;
      __src = memory + 2;
      uVar11 = memory[1];
      p_Var4->block_total_lenght = uVar11;
      local_68 = __src;
      if ((uVar11 & 3) != 0) {
        fprintf(_stderr,"ERROR at %s::%s::%d: %d <= %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
                ,"__parse_mem_copy",0x6f,0,0);
        uVar3 = p_Var4->block_type;
      }
      if ((int)uVar3 < 3) {
        if (uVar3 == 0xb16b00b5) {
          local_60 = memory + 5;
          local_48 = CONCAT44(local_48._4_4_,memory[4]);
          uVar10 = *(ulong *)(memory + 2);
          local_50 = uVar10 & 0xffffffff;
          uVar12 = (ulong)(((uint)uVar10 & 0xfffffffc) + 4);
          if ((uVar10 & 3) == 0) {
            uVar12 = uVar10 & 0xffffffff;
          }
          puVar6 = (ulong *)calloc(1,uVar12 + 0xc);
          *puVar6 = uVar10;
          *(undefined4 *)(puVar6 + 1) = (undefined4)local_48;
          memcpy((void *)((long)puVar6 + 0xc),local_60,local_50);
          lVar2 = (ulong)((uint)uVar12 & 0xfffffffc) + 0x14;
          p_Var4->block_body = (uint32_t *)puVar6;
LAB_001028c7:
          local_68 = (uint *)((long)memory + lVar2);
          max_len = ((int)memory - (int)local_68) + p_Var4->block_total_lenght + -4;
          goto LAB_001028d5;
        }
        if (uVar3 == 1) {
          puVar5 = (uint32_t *)calloc(1,8);
          *puVar5 = memory[2];
          local_68 = memory + 4;
          puVar5[1] = memory[3];
          p_Var4->block_body = puVar5;
          max_len = p_Var4->block_total_lenght - 0x14;
          goto LAB_001028d5;
        }
LAB_00102916:
        uVar11 = p_Var4->block_total_lenght - 0xc;
        if (uVar11 == 0) {
          p_Var4->block_body = (uint32_t *)0x0;
        }
        else {
          puVar5 = (uint32_t *)calloc((ulong)uVar11,1);
          p_Var4->block_body = puVar5;
          memcpy(puVar5,__src,(ulong)uVar11);
          local_68 = (uint *)((ulong)(uVar11 & 0xfffffffc) + (long)__src);
        }
      }
      else if (uVar3 == 3) {
        local_60 = memory + 3;
        uVar3 = memory[2];
        uVar11 = p_Var4->block_total_lenght - 0x10;
        puVar5 = (uint32_t *)calloc(1,(ulong)uVar11 + 0x14);
        *puVar5 = uVar3;
        memcpy(puVar5 + 1,local_60,(ulong)uVar11);
        local_68 = (uint *)((long)memory + (ulong)(uVar11 & 0xfffffffc) + 0xc);
        p_Var4->block_body = puVar5;
        p_Var4->options = (_light_option *)0x0;
      }
      else {
        if (uVar3 == 6) {
          local_60 = memory + 7;
          local_50 = CONCAT44(local_50._4_4_,memory[6]);
          local_48 = *(undefined8 *)(memory + 2);
          uStack_40 = *(undefined8 *)(memory + 4);
          uVar11 = memory[5];
          uVar1 = (uVar11 & 0xfffffffc) + 4;
          if ((uVar11 & 3) == 0) {
            uVar1 = uVar11;
          }
          puVar5 = (uint32_t *)calloc(1,(ulong)uVar1 + 0x14);
          *(undefined8 *)puVar5 = local_48;
          *(undefined8 *)(puVar5 + 2) = uStack_40;
          puVar5[4] = (uint32_t)local_50;
          memcpy(puVar5 + 5,local_60,(ulong)uVar11);
          lVar2 = (ulong)(uVar1 & 0xfffffffc) + 0x1c;
          p_Var4->block_body = puVar5;
          goto LAB_001028c7;
        }
        if (uVar3 != 0xa0d0d0a) goto LAB_00102916;
        puVar5 = (uint32_t *)calloc(1,0x10);
        *puVar5 = memory[2];
        puVar5[1] = memory[3];
        *(undefined8 *)(puVar5 + 2) = *(undefined8 *)(memory + 4);
        local_68 = memory + 6;
        p_Var4->block_body = puVar5;
        max_len = p_Var4->block_total_lenght - 0x1c;
LAB_001028d5:
        p_Var7 = __parse_options(&local_68,max_len);
        p_Var4->options = p_Var7;
      }
      uVar10 = (ulong)*local_68;
      if (*local_68 != p_Var4->block_total_lenght) {
        fprintf(_stderr,"ERROR at %s::%s::%d: %d != %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng.c"
                ,"__parse_mem_copy",0xf8,uVar10,p_Var4->block_total_lenght);
        uVar10 = (ulong)p_Var4->block_total_lenght;
      }
      size = size - uVar10;
      memory = (uint32_t *)((long)memory + (ulong)((uint)uVar10 & 0xfffffffc));
      p_Var8 = p_Var4;
    } while (0xc < size);
  }
  return local_58;
}

Assistant:

static size_t __parse_mem_copy(struct _light_pcapng **iter, const uint32_t *memory, const size_t size)
{
	struct _light_pcapng *current = NULL;
	size_t bytes_read = 0;
	size_t remaining = size;
	size_t block_count = 0;

	*iter = NULL;

	while (remaining > 12) {
		const uint32_t *local_data = (const uint32_t *)(memory);

		if (current == NULL) {
			current = calloc(1, sizeof(struct _light_pcapng));
			DCHECK_NULLP(current, return block_count);

			if (*iter == NULL) {
				*iter = current;
			}
		}
		else {
			current->next_block = calloc(1, sizeof(struct _light_pcapng));
			DCHECK_NULLP(current->next_block, return block_count);

			current = current->next_block;
		}

		current->block_type = *local_data++;
		current->block_total_lenght = *local_data++;
		DCHECK_INT(((current->block_total_lenght % 4) == 0), 0, light_stop);

		switch (current->block_type)
		{
		case LIGHT_SECTION_HEADER_BLOCK:
		{
			DPRINT_HERE(LIGHT_SECTION_HEADER_BLOCK);
			struct _light_section_header *shb = calloc(1, sizeof(struct _light_section_header));
			struct _light_option *opt = NULL;
			uint32_t version;
			int32_t local_offset;

			shb->byteorder_magic = *local_data++;
			// TODO check byte order.
			version = *local_data++;
			shb->major_version = version & 0xFFFF;
			shb->minor_version = (version >> 16) & 0xFFFF;
			shb->section_length = *((uint64_t*)local_data);
			local_data += 2;

			current->block_body = (uint32_t*)shb;
			local_offset = (size_t)local_data - (size_t)memory;
			opt = __parse_options((uint32_t **)&local_data, current->block_total_lenght - local_offset - sizeof(current->block_total_lenght));
			current->options = opt;
		}
		break;

		case LIGHT_INTERFACE_BLOCK:
		{
			DPRINT_HERE(LIGHT_INTERFACE_BLOCK);
			struct _light_interface_description_block *idb = calloc(1, sizeof(struct _light_interface_description_block));
			struct _light_option *opt = NULL;
			uint32_t link_reserved = *local_data++;
			int32_t local_offset;

			idb->link_type = link_reserved & 0xFFFF;
			idb->reserved = (link_reserved >> 16) & 0xFFFF;
			idb->snapshot_length = *local_data++;
			current->block_body = (uint32_t*)idb;
			local_offset = (size_t)local_data - (size_t)memory;
			opt = __parse_options((uint32_t **)&local_data, current->block_total_lenght - local_offset - sizeof(current->block_total_lenght));
			current->options = opt;
		}
		break;

		case LIGHT_ENHANCED_PACKET_BLOCK:
		{
			DPRINT_HERE(LIGHT_ENHANCED_PACKET_BLOCK);
			struct _light_enhanced_packet_block *epb = NULL;
			struct _light_option *opt = NULL;
			uint32_t interface_id = *local_data++;
			uint32_t timestamp_high = *local_data++;
			uint32_t timestamp_low = *local_data++;
			uint32_t captured_packet_length = *local_data++;
			uint32_t original_packet_length = *local_data++;
			int32_t local_offset;
			uint32_t actual_len = 0;

			PADD32(captured_packet_length, &actual_len);

			epb = calloc(1, sizeof(struct _light_enhanced_packet_block) + actual_len);
			epb->interface_id = interface_id;
			epb->timestamp_high = timestamp_high;
			epb->timestamp_low = timestamp_low;
			epb->capture_packet_length = captured_packet_length;
			epb->original_capture_length = original_packet_length;

			memcpy(epb->packet_data, local_data, captured_packet_length); // Maybe actual_len?
			local_data += actual_len / sizeof(uint32_t);
			current->block_body = (uint32_t*)epb;
			local_offset = (size_t)local_data - (size_t)memory;
			opt = __parse_options((uint32_t **)&local_data, current->block_total_lenght - local_offset - sizeof(current->block_total_lenght));
			current->options = opt;
		}
		break;

		case LIGHT_SIMPLE_PACKET_BLOCK:
		{
			DPRINT_HERE(LIGHT_SIMPLE_PACKET_BLOCK);
			struct _light_simple_packet_block *spb = NULL;
			uint32_t original_packet_length = *local_data++;
			uint32_t actual_len = current->block_total_lenght - 2 * sizeof(current->block_total_lenght) - sizeof(current->block_type) - sizeof(original_packet_length);

			spb = calloc(1, sizeof(struct _light_enhanced_packet_block) + actual_len);
			spb->original_packet_length = original_packet_length;

			memcpy(spb->packet_data, local_data, actual_len);
			local_data += actual_len / sizeof(uint32_t);
			current->block_body = (uint32_t*)spb;
			current->options = NULL; // No options defined by the standard for this block type.
		}
		break;

		case LIGHT_CUSTOM_DATA_BLOCK:
		{
			DPRINT_HERE(LIGHT_CUSTOM_DATA_BLOCK);
			struct _light_custom_nonstandard_block *cnb = NULL;
			struct _light_option *opt = NULL;
			uint32_t len = *local_data++;
			uint32_t reserved0 = *local_data++;
			uint32_t reserved1 = *local_data++;
			int32_t local_offset;
			uint32_t actual_len = 0;

			PADD32(len, &actual_len);
			cnb = calloc(1, sizeof(struct _light_custom_nonstandard_block) + actual_len);
			cnb->data_length = len;
			cnb->reserved0 = reserved0;
			cnb->reserved1 = reserved1;

			memcpy(cnb->packet_data, local_data, len); // Maybe actual_len?
			local_data += actual_len / sizeof(uint32_t);
			current->block_body = (uint32_t*)cnb;
			local_offset = (size_t)local_data - (size_t)memory;
			opt = __parse_options((uint32_t **)&local_data, current->block_total_lenght - local_offset - sizeof(current->block_total_lenght));
			current->options = opt;
		}
		break;

		default: // Could not find registered block type. Copying data as RAW.
		{
			DPRINT_HERE(default);
			uint32_t raw_size = current->block_total_lenght - 2 * sizeof(current->block_total_lenght) - sizeof(current->block_type);
			if (raw_size > 0) {
				current->block_body = calloc(raw_size, 1);
				memcpy(current->block_body, local_data, raw_size);
				local_data += raw_size / (sizeof(*local_data));
			}
			else {
				current->block_body = NULL;
			}
		}
		break;
		}

		// Compute offset and return new link.
		// Block total length.
		DCHECK_ASSERT((bytes_read = *local_data++), current->block_total_lenght, light_stop);

		bytes_read = current->block_total_lenght;
		remaining -= bytes_read;
		memory += bytes_read / sizeof(*memory);
		block_count++;
	}

	return block_count;
}